

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

bool slang::parsing::Preprocessor::isSameMacro
               (DefineDirectiveSyntax *left,DefineDirectiveSyntax *right)

{
  MacroFormalArgumentListSyntax *pMVar1;
  MacroFormalArgumentListSyntax *pMVar2;
  MacroArgumentDefaultSyntax *pMVar3;
  Token right_00;
  Token left_00;
  bool bVar4;
  size_t sVar5;
  MacroFormalArgumentSyntax *pMVar6;
  MacroFormalArgumentSyntax *pMVar7;
  iterator laIt;
  undefined8 in_stack_ffffffffffffffa8;
  ParentList *pPVar8;
  ulong uVar9;
  ParentList *pPVar10;
  
  pMVar1 = left->formalArguments;
  pMVar2 = right->formalArguments;
  if ((pMVar1 != (MacroFormalArgumentListSyntax *)0x0) ==
      (pMVar2 == (MacroFormalArgumentListSyntax *)0x0)) {
    return false;
  }
  if (pMVar1 != (MacroFormalArgumentListSyntax *)0x0) {
    sVar5 = (pMVar1->args).elements._M_extent._M_extent_value;
    if (1 < ((pMVar2->args).elements._M_extent._M_extent_value + 1 ^ sVar5 + 1)) {
      return false;
    }
    pPVar10 = &pMVar2->args;
    pPVar8 = &pMVar1->args;
    for (uVar9 = 0; (pPVar8 != &pMVar1->args || (uVar9 != sVar5 + 1 >> 1)); uVar9 = uVar9 + 1) {
      pMVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::
               iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>::dereference
                         ((iterator_base<slang::syntax::MacroFormalArgumentSyntax_*> *)
                          &stack0xffffffffffffffb0);
      pMVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::
               iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>::dereference
                         ((iterator_base<slang::syntax::MacroFormalArgumentSyntax_*> *)
                          &stack0xffffffffffffffc0);
      left_00.info = (Info *)pPVar10;
      left_00.kind = (short)uVar9;
      left_00._2_1_ = (char)(uVar9 >> 0x10);
      left_00.numFlags.raw = (char)(uVar9 >> 0x18);
      left_00.rawLen = (int)(uVar9 >> 0x20);
      right_00.info = (Info *)pPVar8;
      right_00.kind = (short)in_stack_ffffffffffffffa8;
      right_00._2_1_ = (char)((ulong)in_stack_ffffffffffffffa8 >> 0x10);
      right_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffffa8 >> 0x18);
      right_00.rawLen = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      bVar4 = isSameToken(left_00,right_00);
      if (!bVar4) {
        return false;
      }
      pMVar3 = pMVar6->defaultValue;
      if ((pMVar3 != (MacroArgumentDefaultSyntax *)0x0) ==
          (pMVar7->defaultValue == (MacroArgumentDefaultSyntax *)0x0)) {
        return false;
      }
      if ((pMVar3 != (MacroArgumentDefaultSyntax *)0x0) &&
         (bVar4 = isSameTokenList(&pMVar3->tokens,&pMVar7->defaultValue->tokens), !bVar4)) {
        return false;
      }
      sVar5 = (pMVar1->args).elements._M_extent._M_extent_value;
    }
  }
  bVar4 = isSameTokenList(&left->body,&right->body);
  return bVar4;
}

Assistant:

bool Preprocessor::isSameMacro(const DefineDirectiveSyntax& left,
                               const DefineDirectiveSyntax& right) {
    // Names are assumed to match already.
    if (bool(left.formalArguments) != bool(right.formalArguments))
        return false;

    if (left.formalArguments) {
        auto& la = left.formalArguments->args;
        auto& ra = right.formalArguments->args;
        if (la.size() != ra.size())
            return false;

        for (auto laIt = la.begin(), raIt = ra.begin(); laIt != la.end(); laIt++, raIt++) {
            auto leftArg = *laIt;
            auto rightArg = *raIt;
            if (!isSameToken(leftArg->name, rightArg->name))
                return false;

            if (bool(leftArg->defaultValue) != bool(rightArg->defaultValue))
                return false;

            if (leftArg->defaultValue) {
                if (!isSameTokenList(leftArg->defaultValue->tokens, rightArg->defaultValue->tokens))
                    return false;
            }
        }
    }

    return isSameTokenList(left.body, right.body);
}